

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_perlin.h
# Opt level: O2

float stb_perlin_turbulence_noise3(float x,float y,float z,float lacunarity,float gain,int octaves)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  iVar1 = 0;
  if (octaves < 1) {
    octaves = 0;
  }
  fVar2 = 0.0;
  fVar4 = 1.0;
  fVar5 = 1.0;
  for (; octaves != iVar1; iVar1 = iVar1 + 1) {
    fVar3 = stb_perlin_noise3_internal(fVar4 * x,fVar4 * y,fVar4 * z,0,0,0,(uchar)iVar1);
    fVar2 = fVar2 + ABS(fVar3 * fVar5);
    fVar4 = fVar4 * lacunarity;
    fVar5 = fVar5 * gain;
  }
  return fVar2;
}

Assistant:

float stb_perlin_turbulence_noise3(float x, float y, float z, float lacunarity, float gain, int octaves)
{
   int i;
   float frequency = 1.0f;
   float amplitude = 1.0f;
   float sum = 0.0f;

   for (i = 0; i < octaves; i++) {
      float r = stb_perlin_noise3_internal(x*frequency,y*frequency,z*frequency,0,0,0,(unsigned char)i)*amplitude;
      sum += (float) fabs(r);
      frequency *= lacunarity;
      amplitude *= gain;
   }
   return sum;
}